

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

RECEIVED_HANDLE received_clone(RECEIVED_HANDLE value)

{
  AMQP_VALUE pAVar1;
  RECEIVED_HANDLE local_18;
  RECEIVED_INSTANCE *received_instance;
  RECEIVED_HANDLE value_local;
  
  local_18 = (RECEIVED_HANDLE)malloc(8);
  if (local_18 != (RECEIVED_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (RECEIVED_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

RECEIVED_HANDLE received_clone(RECEIVED_HANDLE value)
{
    RECEIVED_INSTANCE* received_instance = (RECEIVED_INSTANCE*)malloc(sizeof(RECEIVED_INSTANCE));
    if (received_instance != NULL)
    {
        received_instance->composite_value = amqpvalue_clone(((RECEIVED_INSTANCE*)value)->composite_value);
        if (received_instance->composite_value == NULL)
        {
            free(received_instance);
            received_instance = NULL;
        }
    }

    return received_instance;
}